

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O2

string * __thiscall
Vault::Base64::encode_abi_cxx11_
          (string *__return_storage_ptr__,Base64 *this,uchar *bytes_to_encode,uint in_len)

{
  Base64 BVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  string base64_chars;
  
  uVar4 = (ulong)bytes_to_encode & 0xffffffff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&base64_chars,
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",
             (allocator<char> *)char_array_4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  char_array_3[0] = '\0';
  char_array_3[1] = '\0';
  char_array_3[2] = '\0';
  char_array_4[0] = '\0';
  char_array_4[1] = '\0';
  char_array_4[2] = '\0';
  char_array_4[3] = '\0';
  uVar2 = 0;
  while( true ) {
    iVar6 = (int)uVar2;
    iVar3 = (int)uVar4;
    uVar4 = (ulong)(iVar3 - 1);
    cVar5 = (char)__return_storage_ptr__;
    if (iVar3 == 0) break;
    BVar1 = *this;
    this = this + 1;
    *(Base64 *)(char_array_3 + uVar2) = BVar1;
    uVar2 = (ulong)(iVar6 + 1U);
    if (iVar6 + 1U == 3) {
      char_array_4._0_2_ =
           CONCAT11((char_array_3[0] & 3) << 4 | char_array_3[1] >> 4,char_array_3[0] >> 2);
      char_array_4._0_3_ =
           CONCAT12((char_array_3[1] & 0xf) << 2 | char_array_3[2] >> 6,char_array_4._0_2_);
      char_array_4 = (uchar  [4])(CONCAT13(char_array_3[2],char_array_4._0_3_) & 0x3fffffff);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        std::__cxx11::string::push_back(cVar5);
      }
      uVar2 = 0;
    }
  }
  if (iVar6 != 0) {
    for (; (int)uVar2 < 3; uVar2 = uVar2 + 1) {
      char_array_3[uVar2] = '\0';
    }
    char_array_4._0_2_ =
         CONCAT11((char_array_3[0] & 3) << 4 | char_array_3[1] >> 4,char_array_3[0] >> 2);
    char_array_4._0_3_ =
         CONCAT12((char_array_3[1] & 0xf) << 2 | char_array_3[2] >> 6,char_array_4._0_2_);
    char_array_4 = (uchar  [4])(CONCAT13(char_array_3[2],char_array_4._0_3_) & 0x3fffffff);
    for (lVar7 = 0; lVar7 <= iVar6; lVar7 = lVar7 + 1) {
      std::__cxx11::string::push_back(cVar5);
    }
    iVar6 = iVar6 + -1;
    while (iVar6 = iVar6 + 1, iVar6 < 3) {
      std::__cxx11::string::push_back(cVar5);
    }
  }
  std::__cxx11::string::~string((string *)&base64_chars);
  return __return_storage_ptr__;
}

Assistant:

std::string Vault::Base64::encode(unsigned char const *bytes_to_encode,
                                  unsigned int in_len) {
  std::string base64_chars =
      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3] = {0};
  unsigned char char_array_4[4] = {0};

  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++) {
        ret += base64_chars[char_array_4[i]];
      }

      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 3; j++) {
      char_array_3[j] = '\0';
    }

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++) {
      ret += base64_chars[char_array_4[j]];
    }

    while ((i++ < 3)) {
      ret += '=';
    }
  }

  return ret;
}